

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_bounded_q.h
# Opt level: O1

bool __thiscall
spdlog::details::mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::dequeue
          (mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this,async_msg *data)

{
  __int_type_conflict _Var1;
  ulong uVar2;
  __int_type_conflict _Var3;
  char cVar4;
  __int_type_conflict _Var5;
  cell_t *pcVar6;
  bool bVar7;
  
  _Var5 = (this->dequeue_pos_).super___atomic_base<unsigned_long>._M_i;
  do {
    pcVar6 = this->buffer_;
    uVar2 = this->buffer_mask_ & _Var5;
    _Var3 = pcVar6[uVar2].sequence_.super___atomic_base<unsigned_long>._M_i;
    _Var1 = _Var5 + 1;
    if (_Var3 == _Var1) {
      LOCK();
      _Var3 = (this->dequeue_pos_).super___atomic_base<unsigned_long>._M_i;
      bVar7 = _Var5 == _Var3;
      if (bVar7) {
        (this->dequeue_pos_).super___atomic_base<unsigned_long>._M_i = _Var1;
        _Var3 = _Var5;
      }
      UNLOCK();
      cVar4 = bVar7 * '\x02';
      _Var5 = _Var3;
    }
    else {
      cVar4 = '\x01';
      if ((long)_Var1 <= (long)_Var3) {
        _Var5 = (this->dequeue_pos_).super___atomic_base<unsigned_long>._M_i;
        cVar4 = '\0';
      }
    }
  } while (cVar4 == '\0');
  if (cVar4 == '\x02') {
    pcVar6 = pcVar6 + uVar2;
    async_log_helper::async_msg::operator=(data,&pcVar6->data_);
    (pcVar6->sequence_).super___atomic_base<unsigned_long>._M_i = this->buffer_mask_ + _Var5 + 1;
  }
  return cVar4 == '\x02';
}

Assistant:

bool dequeue(T &data)
    {
        cell_t *cell;
        size_t pos = dequeue_pos_.load(std::memory_order_relaxed);
        for (;;)
        {
            cell = &buffer_[pos & buffer_mask_];
            size_t seq = cell->sequence_.load(std::memory_order_acquire);
            intptr_t dif = static_cast<intptr_t>(seq) - static_cast<intptr_t>(pos + 1);
            if (dif == 0)
            {
                if (dequeue_pos_.compare_exchange_weak(pos, pos + 1, std::memory_order_relaxed))
                {
                    break;
                }
            }
            else if (dif < 0)
            {
                return false;
            }
            else
            {
                pos = dequeue_pos_.load(std::memory_order_relaxed);
            }
        }
        data = std::move(cell->data_);
        cell->sequence_.store(pos + buffer_mask_ + 1, std::memory_order_release);
        return true;
    }